

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

void __thiscall zmq::detail::socket_base::disconnect(socket_base *this,char *addr_)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int rc;
  error_t *in_stack_ffffffffffffffe0;
  
  iVar1 = zmq_disconnect(*in_RDI,in_RSI);
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t(in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return;
}

Assistant:

void disconnect(const char *addr_)
    {
        int rc = zmq_disconnect(_handle, addr_);
        if (rc != 0)
            throw error_t();
    }